

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cpp
# Opt level: O0

void foundit(skiplist<DictKey,_std::less<DictKey>_> *s,DictKey *x)

{
  bool bVar1;
  void *this;
  ostream *poVar2;
  iterator local_80;
  DictKey local_58;
  undefined1 local_30 [8];
  iterator itr;
  DictKey *x_local;
  skiplist<DictKey,_std::less<DictKey>_> *s_local;
  
  itr.node = (SLNode<DictKey> *)x;
  DictKey::DictKey(&local_58,x);
  skiplist<DictKey,_std::less<DictKey>_>::find((iterator *)local_30,s,&local_58);
  DictKey::~DictKey(&local_58);
  std::end<skiplist<DictKey,std::less<DictKey>>>(&local_80,s);
  bVar1 = skiplist<DictKey,_std::less<DictKey>_>::cake_iterator<false>::operator!=
                    ((cake_iterator<false> *)local_30,&local_80);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Value: ");
    poVar2 = operator<<(poVar2,(DictKey *)(itr._8_8_ + 0x20));
    poVar2 = std::operator<<(poVar2," Count: ");
    this = (void *)std::ostream::operator<<(poVar2,*(int *)(itr._8_8_ + 0x60));
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"Not found: ");
    poVar2 = operator<<(poVar2,x);
    std::operator<<(poVar2,"\n");
  }
  return;
}

Assistant:

void foundit(skiplist<DictKey> &s, DictKey x) {
  skiplist<DictKey>::iterator itr = s.find(x);
  if (itr != std::end(s))
    std::cout << "Value: " << itr.node->val << " Count: " << itr.node->count
         << std::endl;
  else
    std::cout << "Not found: " << x << "\n";
}